

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::UniformCase::generateBasicUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniformsDst,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsDst,VarType *varType,char *varName,bool isParentActive,
          int *samplerUnitCounter,Random *rnd)

{
  undefined4 uVar1;
  undefined1 uVar2;
  bool bVar3;
  DataType DVar4;
  int iVar5;
  size_type sVar6;
  char *rootName_;
  StructType *this_00;
  char *pcVar7;
  VarType *pVVar8;
  reference rVar9;
  bool local_595;
  byte local_559;
  bool local_4ea;
  bool local_4e9;
  bool local_49a;
  bool local_499;
  allocator<char> local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  string memberFullName;
  StructMember *member;
  int i;
  StructType *structType;
  reference local_3c0;
  int local_3ac;
  undefined1 local_3a8 [4];
  int minSize;
  undefined1 local_30c [8];
  VarValue value_1;
  DataType elemBasicType;
  bool isCurElemActive;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string indexedName;
  undefined1 local_1f0 [4];
  int elemNdx;
  vector<bool,_std::allocator<bool>_> isElemActive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string arrayRootName;
  undefined1 local_158 [4];
  int size;
  BasicUniform local_118;
  undefined1 local_7c [8];
  VarValue value;
  DataType type;
  bool isActive;
  bool isParentActive_local;
  char *varName_local;
  VarType *varType_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsDst_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *basicUniformsDst_local;
  UniformCase *this_local;
  
  value.val._63_1_ = isParentActive;
  bVar3 = glu::VarType::isBasicType(varType);
  if (bVar3) {
    local_499 = false;
    if ((value.val._63_1_ & 1) != 0) {
      if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x20) == 0) {
        local_49a = true;
      }
      else {
        sVar6 = std::
                vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                ::size(basicUniformsDst);
        local_49a = (sVar6 & 1) == 0;
      }
      local_499 = local_49a;
    }
    value.val._62_1_ = local_499;
    value.val.floatV[0xe] = (float)glu::VarType::getBasicType(varType);
    bVar3 = glu::isDataTypeSampler((DataType)value.val.floatV[0xe]);
    if (bVar3) {
      iVar5 = *samplerUnitCounter;
      *samplerUnitCounter = iVar5 + 1;
      generateRandomVarValue((VarValue *)local_7c,(DataType)value.val.floatV[0xe],rnd,iVar5);
    }
    else {
      DVar4 = glu::VarType::getBasicType(varType);
      generateRandomVarValue((VarValue *)local_7c,DVar4,rnd,-1);
    }
    DVar4 = glu::VarType::getBasicType(varType);
    BasicUniform::BasicUniform
              (&local_118,varName,DVar4,(bool)(value.val._62_1_ & 1),(VarValue *)local_7c,
               (char *)0x0,-1,1);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
    ::push_back(basicUniformsDst,&local_118);
    BasicUniform::~BasicUniform(&local_118);
    DVar4 = glu::VarType::getBasicType(varType);
    BasicUniformReportRef::BasicUniformReportRef
              ((BasicUniformReportRef *)local_158,varName,DVar4,(bool)(value.val._62_1_ & 1));
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
    ::push_back(basicUniformReportsDst,(BasicUniformReportRef *)local_158);
    BasicUniformReportRef::~BasicUniformReportRef((BasicUniformReportRef *)local_158);
  }
  else {
    bVar3 = glu::VarType::isArrayType(varType);
    if (bVar3) {
      arrayRootName.field_2._12_4_ = glu::VarType::getArraySize(varType);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"",
                 (allocator<char> *)
                 ((long)&isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_1a0,&local_1c0,varName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_1a0,"[0]");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage + 7));
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_1f0);
      for (indexedName.field_2._12_4_ = 0; uVar1 = indexedName.field_2._12_4_,
          iVar5 = glu::VarType::getArraySize(varType), (int)uVar1 < iVar5;
          indexedName.field_2._12_4_ = indexedName.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
        std::operator+(&local_278,&local_298,varName);
        std::operator+(&local_258,&local_278,"[");
        de::toString<int>((string *)&elemBasicType,(int *)(indexedName.field_2._M_local_buf + 0xc));
        std::operator+(&local_238,&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &elemBasicType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218,&local_238,"]");
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&elemBasicType);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
        local_4e9 = false;
        if ((value.val._63_1_ & 1) != 0) {
          if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x20) != 0) {
            sVar6 = std::
                    vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                    ::size(basicUniformsDst);
            local_4e9 = false;
            if ((sVar6 & 1) != 0) goto LAB_02228857;
          }
          local_4ea = (*(uint *)&(this->super_CallLogWrapper).field_0x14 & 1) == 0 ||
                      indexedName.field_2._12_4_ == (int)arrayRootName.field_2._12_4_ / 2;
          local_4e9 = local_4ea;
        }
LAB_02228857:
        value_1.val._63_1_ = local_4e9;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_1f0,local_4e9);
        pVVar8 = glu::VarType::getElementType(varType);
        bVar3 = glu::VarType::isBasicType(pVVar8);
        if (bVar3) {
          pVVar8 = glu::VarType::getElementType(varType);
          value_1.val.floatV[0xe] = (float)glu::VarType::getBasicType(pVVar8);
          bVar3 = glu::isDataTypeSampler((DataType)value_1.val.floatV[0xe]);
          if (bVar3) {
            iVar5 = *samplerUnitCounter;
            *samplerUnitCounter = iVar5 + 1;
            generateRandomVarValue
                      ((VarValue *)local_30c,(DataType)value_1.val.floatV[0xe],rnd,iVar5);
          }
          else {
            generateRandomVarValue((VarValue *)local_30c,(DataType)value_1.val.floatV[0xe],rnd,-1);
          }
          pcVar7 = (char *)std::__cxx11::string::c_str();
          uVar2 = value_1.val._63_1_;
          uVar1 = value_1.val.floatV[0xe];
          rootName_ = (char *)std::__cxx11::string::c_str();
          BasicUniform::BasicUniform
                    ((BasicUniform *)local_3a8,pcVar7,uVar1,(bool)(uVar2 & 1),(VarValue *)local_30c,
                     rootName_,indexedName.field_2._12_4_,arrayRootName.field_2._12_4_);
          std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::push_back(basicUniformsDst,(value_type *)local_3a8);
          BasicUniform::~BasicUniform((BasicUniform *)local_3a8);
        }
        else {
          pVVar8 = glu::VarType::getElementType(varType);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          generateBasicUniforms
                    (this,basicUniformsDst,basicUniformReportsDst,pVVar8,pcVar7,
                     (bool)(value_1.val._63_1_ & 1),samplerUnitCounter,rnd);
        }
        std::__cxx11::string::~string((string *)local_218);
      }
      pVVar8 = glu::VarType::getElementType(varType);
      bVar3 = glu::VarType::isBasicType(pVVar8);
      if (bVar3) {
        local_3ac = glu::VarType::getArraySize(varType);
        while( true ) {
          local_559 = 0;
          if (0 < local_3ac) {
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_1f0,
                               (long)(local_3ac + -1));
            local_3c0 = rVar9;
            bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_3c0);
            local_559 = bVar3 ^ 0xff;
          }
          if ((local_559 & 1) == 0) break;
          local_3ac = local_3ac + -1;
        }
        pcVar7 = (char *)std::__cxx11::string::c_str();
        uVar1 = arrayRootName.field_2._12_4_;
        iVar5 = local_3ac;
        pVVar8 = glu::VarType::getElementType(varType);
        DVar4 = glu::VarType::getBasicType(pVVar8);
        local_595 = (value.val._63_1_ & 1) != 0 && 0 < local_3ac;
        BasicUniformReportRef::BasicUniformReportRef
                  ((BasicUniformReportRef *)&structType,pcVar7,iVar5,uVar1,DVar4,local_595);
        std::
        vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
        ::push_back(basicUniformReportsDst,(value_type *)&structType);
        BasicUniformReportRef::~BasicUniformReportRef((BasicUniformReportRef *)&structType);
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_1f0);
      std::__cxx11::string::~string((string *)local_180);
    }
    else {
      this_00 = glu::VarType::getStructPtr(varType);
      for (member._4_4_ = 0; iVar5 = glu::StructType::getNumMembers(this_00), member._4_4_ < iVar5;
          member._4_4_ = member._4_4_ + 1) {
        memberFullName.field_2._8_8_ = glu::StructType::getMember(this_00,member._4_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
        std::operator+(&local_468,&local_488,varName);
        std::operator+(&local_448,&local_468,".");
        pcVar7 = glu::StructMember::getName((StructMember *)memberFullName.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_428,&local_448,pcVar7);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator(&local_489);
        pVVar8 = glu::StructMember::getType((StructMember *)memberFullName.field_2._8_8_);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        generateBasicUniforms
                  (this,basicUniformsDst,basicUniformReportsDst,pVVar8,pcVar7,
                   (bool)(value.val._63_1_ & 1),samplerUnitCounter,rnd);
        std::__cxx11::string::~string((string *)local_428);
      }
    }
  }
  return;
}

Assistant:

void UniformCase::generateBasicUniforms (vector<BasicUniform>& basicUniformsDst, vector<BasicUniformReportRef>& basicUniformReportsDst, const glu::VarType& varType, const char* const varName, const bool isParentActive, int& samplerUnitCounter, Random& rnd) const
{
	if (varType.isBasicType())
	{
		const bool				isActive	= isParentActive && (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER ? basicUniformsDst.size() % 2 == 0 : true);
		const glu::DataType		type		= varType.getBasicType();
		const VarValue			value		= glu::isDataTypeSampler(type) ? generateRandomVarValue(type, rnd, samplerUnitCounter++)
																		   : generateRandomVarValue(varType.getBasicType(), rnd);

		basicUniformsDst.push_back(BasicUniform(varName, varType.getBasicType(), isActive, value));
		basicUniformReportsDst.push_back(BasicUniformReportRef(varName, varType.getBasicType(), isActive));
	}
	else if (varType.isArrayType())
	{
		const int		size			= varType.getArraySize();
		const string	arrayRootName	= string("") + varName + "[0]";
		vector<bool>	isElemActive;

		for (int elemNdx = 0; elemNdx < varType.getArraySize(); elemNdx++)
		{
			const string	indexedName		= string("") + varName + "[" + de::toString(elemNdx) + "]";
			const bool		isCurElemActive	= isParentActive																						&&
											  (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER			? basicUniformsDst.size() % 2 == 0	: true)	&&
											  (m_features & FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX		? elemNdx == size/2					: true);

			isElemActive.push_back(isCurElemActive);

			if (varType.getElementType().isBasicType())
			{
				// \note We don't want separate entries in basicUniformReportsDst for elements of basic-type arrays.
				const glu::DataType	elemBasicType	= varType.getElementType().getBasicType();
				const VarValue		value			= glu::isDataTypeSampler(elemBasicType) ? generateRandomVarValue(elemBasicType, rnd, samplerUnitCounter++)
																							: generateRandomVarValue(elemBasicType, rnd);

				basicUniformsDst.push_back(BasicUniform(indexedName.c_str(), elemBasicType, isCurElemActive, value, arrayRootName.c_str(), elemNdx, size));
			}
			else
				generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, varType.getElementType(), indexedName.c_str(), isCurElemActive, samplerUnitCounter, rnd);
		}

		if (varType.getElementType().isBasicType())
		{
			int minSize;
			for (minSize = varType.getArraySize(); minSize > 0 && !isElemActive[minSize-1]; minSize--);

			basicUniformReportsDst.push_back(BasicUniformReportRef(arrayRootName.c_str(), minSize, size, varType.getElementType().getBasicType(), isParentActive && minSize > 0));
		}
	}
	else
	{
		DE_ASSERT(varType.isStructType());

		const StructType& structType = *varType.getStructPtr();

		for (int i = 0; i < structType.getNumMembers(); i++)
		{
			const glu::StructMember&	member			= structType.getMember(i);
			const string				memberFullName	= string("") + varName + "." + member.getName();

			generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, member.getType(), memberFullName.c_str(), isParentActive, samplerUnitCounter, rnd);
		}
	}
}